

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateConstructorAccess
          (ExpressionContext *ctx,SynBase *source,TypeBase *type,bool noArguments,ExprBase *context)

{
  bool bVar1;
  ExprBase *pEVar2;
  ArrayView<FunctionData_*> functions_00;
  SmallArray<FunctionData_*,_32U> functions;
  SmallArray<FunctionData_*,_32U> local_130;
  
  local_130.allocator = ctx->allocator;
  local_130.data = local_130.little;
  local_130.count = 0;
  local_130.max = 0x20;
  bVar1 = GetTypeConstructorFunctions(ctx,type,noArguments,&local_130);
  if (bVar1) {
    functions_00.count = local_130.count;
    functions_00.data = local_130.data;
    functions_00._12_4_ = 0;
    pEVar2 = CreateConstructorAccess(ctx,source,functions_00,context);
  }
  else {
    pEVar2 = (ExprBase *)0x0;
  }
  SmallArray<FunctionData_*,_32U>::~SmallArray(&local_130);
  return pEVar2;
}

Assistant:

ExprBase* CreateConstructorAccess(ExpressionContext &ctx, SynBase *source, TypeBase *type, bool noArguments, ExprBase *context)
{
	SmallArray<FunctionData*, 32> functions(ctx.allocator);

	if(GetTypeConstructorFunctions(ctx, type, noArguments, functions))
		return CreateConstructorAccess(ctx, source, functions, context);

	return NULL;
}